

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

Table * wasm::ModuleUtils::copyTable(Table *table,Module *out)

{
  char *pcVar1;
  size_t sVar2;
  size_t *psVar3;
  Table *pTVar4;
  __single_object ret;
  
  psVar3 = (size_t *)operator_new(0x50);
  psVar3[8] = 0;
  psVar3[9] = 0;
  *psVar3 = 0;
  psVar3[1] = 0;
  psVar3[2] = 0;
  psVar3[3] = 0;
  psVar3[4] = 0;
  psVar3[5] = 0;
  psVar3[6] = 0;
  psVar3[7] = 0;
  psVar3[8] = 0xffffffff;
  wasm::Type::Type((Type *)(psVar3 + 9),(HeapType)0x1,Nullable);
  pcVar1 = (table->super_Importable).super_Named.name.super_IString.str._M_str;
  *psVar3 = (table->super_Importable).super_Named.name.super_IString.str._M_len;
  psVar3[1] = (size_t)pcVar1;
  *(bool *)(psVar3 + 2) = (table->super_Importable).super_Named.hasExplicitName;
  psVar3[9] = (table->type).id;
  pcVar1 = (table->super_Importable).module.super_IString.str._M_str;
  psVar3[3] = (table->super_Importable).module.super_IString.str._M_len;
  psVar3[4] = (size_t)pcVar1;
  pcVar1 = (table->super_Importable).base.super_IString.str._M_str;
  psVar3[5] = (table->super_Importable).base.super_IString.str._M_len;
  psVar3[6] = (size_t)pcVar1;
  sVar2 = (table->max).addr;
  psVar3[7] = (table->initial).addr;
  psVar3[8] = sVar2;
  pTVar4 = (Table *)wasm::Module::addTable((unique_ptr *)out);
  if (psVar3 != (size_t *)0x0) {
    operator_delete(psVar3,0x50);
  }
  return pTVar4;
}

Assistant:

inline Table* copyTable(const Table* table, Module& out) {
  auto ret = std::make_unique<Table>();
  ret->name = table->name;
  ret->hasExplicitName = table->hasExplicitName;
  ret->type = table->type;
  ret->module = table->module;
  ret->base = table->base;

  ret->initial = table->initial;
  ret->max = table->max;

  return out.addTable(std::move(ret));
}